

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

LinkIndex __thiscall iDynTree::Model::getFrameLink(Model *this,FrameIndex frameIndex)

{
  LinkIndex LVar1;
  LinkIndex LVar2;
  size_t sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  Model *this_00;
  char *pcVar6;
  long in_RSI;
  long in_RDI;
  stringstream ss;
  Model *in_stack_fffffffffffffdf0;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  LinkIndex local_18;
  LinkIndex local_8;
  
  local_18 = in_RSI;
  if ((-1 < in_RSI) && (sVar3 = getNrOfLinks((Model *)0x448116), in_RSI < (long)sVar3)) {
    return local_18;
  }
  LVar1 = local_18;
  sVar3 = getNrOfLinks((Model *)0x44814f);
  LVar2 = local_18;
  if (((long)sVar3 <= LVar1) &&
     (sVar3 = getNrOfFrames(in_stack_fffffffffffffdf0), LVar2 < (long)sVar3)) {
    sVar3 = getNrOfLinks((Model *)0x4481a3);
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x50),local_18 - sVar3);
    return *pvVar4;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar5 = std::operator<<(local_190,"frameIndex ");
  this_00 = (Model *)std::ostream::operator<<(poVar5,local_18);
  poVar5 = std::operator<<((ostream *)this_00," is not valid, should be between 0 and ");
  sVar3 = getNrOfFrames(this_00);
  std::ostream::operator<<(poVar5,sVar3 - 1);
  std::__cxx11::stringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iDynTree::reportError("Model","getFrameLink",pcVar6);
  std::__cxx11::string::~string(local_1d0);
  local_8 = LINK_INVALID_INDEX;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return local_8;
}

Assistant:

LinkIndex Model::getFrameLink(const FrameIndex frameIndex) const
{
    // The link_H_frame transform for the link
    // main frame is the link it self
    if( frameIndex >= 0 &&
        frameIndex < (FrameIndex) this->getNrOfLinks() )
    {
        return (LinkIndex)frameIndex;
    }

    if( frameIndex >= (FrameIndex) this->getNrOfLinks() &&
        frameIndex < (FrameIndex) this->getNrOfFrames() )
    {
        // For an additonal frame the link index is instead stored
        // in the additionalFramesLinks vector
        return this->additionalFramesLinks[frameIndex-getNrOfLinks()];
    }

    // If the frameIndex is out of bounds, return an invalid index
    std::stringstream ss;
    ss << "frameIndex " << frameIndex << " is not valid, should be between 0 and " << this->getNrOfFrames()-1;
    reportError("Model","getFrameLink",ss.str().c_str());
    return LINK_INVALID_INDEX;
}